

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O3

void __thiscall
TArray<ACSStringPool::PoolEntry,_ACSStringPool::PoolEntry>::Resize
          (TArray<ACSStringPool::PoolEntry,_ACSStringPool::PoolEntry> *this,uint amount)

{
  uint uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint amount_00;
  long lVar4;
  long lVar5;
  PoolEntry *pPVar6;
  ulong uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  uVar1 = this->Count;
  amount_00 = amount - uVar1;
  if (amount < uVar1 || amount_00 == 0) {
    if (amount_00 != 0) {
      DoDelete(this,amount,uVar1 - 1);
    }
  }
  else {
    Grow(this,amount_00);
    auVar3 = _DAT_0073b300;
    auVar2 = _DAT_0073b2f0;
    uVar1 = this->Count;
    if (uVar1 < amount) {
      lVar4 = (ulong)amount - (ulong)uVar1;
      lVar5 = lVar4 + -1;
      auVar8._8_4_ = (int)lVar5;
      auVar8._0_8_ = lVar5;
      auVar8._12_4_ = (int)((ulong)lVar5 >> 0x20);
      pPVar6 = this->Array + uVar1;
      uVar7 = 0;
      auVar8 = auVar8 ^ _DAT_0073b300;
      do {
        auVar9._8_4_ = (int)uVar7;
        auVar9._0_8_ = uVar7;
        auVar9._12_4_ = (int)(uVar7 >> 0x20);
        auVar9 = (auVar9 | auVar2) ^ auVar3;
        if ((bool)(~(auVar9._4_4_ == auVar8._4_4_ && auVar8._0_4_ < auVar9._0_4_ ||
                    auVar8._4_4_ < auVar9._4_4_) & 1)) {
          (pPVar6->Str).Chars = (char *)0x8a502c;
        }
        if ((auVar9._12_4_ != auVar8._12_4_ || auVar9._8_4_ <= auVar8._8_4_) &&
            auVar9._12_4_ <= auVar8._12_4_) {
          pPVar6[1].Str.Chars = (char *)0x8a502c;
        }
        uVar7 = uVar7 + 2;
        pPVar6 = pPVar6 + 2;
      } while ((lVar4 + 1U & 0xfffffffffffffffe) != uVar7);
      FString::NullString.RefCount = (FString::NullString.RefCount + amount) - uVar1;
    }
  }
  this->Count = amount;
  return;
}

Assistant:

void Resize (unsigned int amount)
	{
		if (Count < amount)
		{
			// Adding new entries
			Grow (amount - Count);
			for (unsigned int i = Count; i < amount; ++i)
			{
				::new((void *)&Array[i]) T;
			}
		}
		else if (Count != amount)
		{
			// Deleting old entries
			DoDelete (amount, Count - 1);
		}
		Count = amount;
	}